

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O0

ClearOp * deqp::egl::computeRandomClear
                    (ClearOp *__return_storage_ptr__,Random *rnd,int width,int height)

{
  int width_;
  int height_;
  deUint32 val;
  RGBA local_2c;
  int local_28;
  RGBA col;
  int y;
  int x;
  int h;
  int w;
  int height_local;
  int width_local;
  Random *rnd_local;
  
  width_ = de::Random::getInt(rnd,1,width);
  height_ = de::Random::getInt(rnd,1,height);
  col.m_value = de::Random::getInt(rnd,0,width - width_);
  local_28 = de::Random::getInt(rnd,0,height - height_);
  val = de::Random::getUint32(rnd);
  tcu::RGBA::RGBA(&local_2c,val);
  ClearOp::ClearOp(__return_storage_ptr__,col.m_value,local_28,width_,height_,&local_2c);
  return __return_storage_ptr__;
}

Assistant:

static ClearOp computeRandomClear (de::Random& rnd, int width, int height)
{
	int			w		= rnd.getInt(1, width);
	int			h		= rnd.getInt(1, height);
	int			x		= rnd.getInt(0, width-w);
	int			y		= rnd.getInt(0, height-h);
	tcu::RGBA	col		(rnd.getUint32());

	return ClearOp(x, y, w, h, col);
}